

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

Write<double> __thiscall Omega_h::deep_copy<double>(Omega_h *this,Read<signed_char> *a,string *name)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  size_t sVar2;
  Write<double> WVar3;
  ScopedTimer omega_h_scoped_function_timer;
  string name2;
  ScopedTimer local_ba;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Write<double> local_98;
  Write<double> local_88;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array.cpp"
             ,&local_b9);
  std::operator+(&local_38,&local_58,":");
  std::__cxx11::to_string(&local_78,0x15a);
  std::operator+(&local_b8,&local_38,&local_78);
  begin_code("deep_copy",local_b8._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  if (name->_M_string_length == 0) {
    Read<double>::name_abi_cxx11_(&local_b8,(Read<double> *)a);
  }
  else {
    std::__cxx11::string::string((string *)&local_b8,(string *)name);
  }
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  Write<double>::Write((Write<double> *)this,(LO)(sVar2 >> 3),&local_b8);
  Write<double>::Write(&local_88,(Write<double> *)a);
  Write<double>::Write(&local_98,(Write<double> *)this);
  copy_into<double>((Read<signed_char> *)&local_88,&local_98);
  Write<double>::~Write(&local_98);
  Write<double>::~Write(&local_88);
  std::__cxx11::string::~string((string *)&local_b8);
  ScopedTimer::~ScopedTimer(&local_ba);
  WVar3.shared_alloc_.direct_ptr = extraout_RDX;
  WVar3.shared_alloc_.alloc = (Alloc *)this;
  return (Write<double>)WVar3.shared_alloc_;
}

Assistant:

Write<T> deep_copy(Read<T> a, std::string const& name) {
  OMEGA_H_TIME_FUNCTION;
  auto name2 = name.empty() ? a.name() : name;
  Write<T> b(a.size(), name2);
  copy_into(a, b);
  return b;
}